

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O0

void __thiscall
TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
          (TPZStepSolver<std::complex<long_double>_> *this,void **vtt,
          TPZStepSolver<std::complex<long_double>_> *copy)

{
  long lVar1;
  list<long,_std::allocator<long>_> *in_RDX;
  TPZMatrixSolver<std::complex<long_double>_> *in_RSI;
  undefined8 *in_RDI;
  undefined8 local_50;
  TPZMatrixSolver<std::complex<long_double>_> *in_stack_ffffffffffffffe0;
  TPZMatrixSolver<std::complex<long_double>_> *this_00;
  
  this_00 = in_RSI;
  TPZMatrixSolver<std::complex<long_double>_>::TPZMatrixSolver
            (in_RSI,(void **)in_RDX,in_stack_ffffffffffffffe0);
  *in_RDI = (in_RSI->super_TPZSolver).super_TPZSavable._vptr_TPZSavable;
  in_RDI[0x17] = in_RDX[7].super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)this_00,in_RDX);
  *(undefined4 *)(in_RDI + 0x15) =
       *(undefined4 *)
        &in_RDX[7].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
         super__List_node_base._M_next;
  *(undefined4 *)((long)in_RDI + 0xac) =
       *(undefined4 *)
        ((long)&in_RDX[7].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                super__List_node_base._M_next + 4);
  in_RDI[0x16] = in_RDX[7].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
  in_RDI[0x19] = in_RDX[8].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
  in_RDI[0x1a] = in_RDX[8].super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
  in_RDI[0x1b] = 0;
  if (in_RDX[9].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
      _M_next != (_List_node_base *)0x0) {
    lVar1 = (*(code *)*(_List_node_base **)
                       ((long)((in_RDX[9].super__List_base<long,_std::allocator<long>_>._M_impl.
                                _M_node.super__List_node_base._M_next)->_M_next + 4) + 8))();
    if (lVar1 == 0) {
      local_50 = 0;
    }
    else {
      local_50 = __dynamic_cast(lVar1,&TPZSolver::typeinfo,
                                &TPZMatrixSolver<std::complex<long_double>>::typeinfo,0);
    }
    in_RDI[0x1b] = local_50;
  }
  in_RDI[0x1c] = in_RDX[9].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
  *(undefined4 *)(in_RDI + 0x18) =
       *(undefined4 *)
        &in_RDX[8].super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
         super__List_node_base._M_next;
  return;
}

Assistant:

TPZStepSolver<TVar>::TPZStepSolver(const TPZStepSolver<TVar> & copy) : TPZRegisterClassId(&TPZStepSolver::ClassId),
TPZMatrixSolver<TVar>(copy), fNumIterations(copy.fNumIterations) , fSingular(copy.fSingular){
    fSolver = copy.fSolver;
    fDecompose = copy.fDecompose;
    fMaxIterations = copy.fMaxIterations;
    fTol = copy.fTol;
    fOverRelax = copy.fOverRelax;
    fPrecond = 0;
    if(copy.fPrecond) fPrecond = dynamic_cast<TPZMatrixSolver<TVar>*>(copy.fPrecond->Clone());
    fFromCurrent = copy.fFromCurrent;
    fNumVectors = copy.fNumVectors;//Cedric: 24/04/2003 - 12:39
}